

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O2

void __thiscall
solitaire::SolitaireEmptyHandTest_tryPullOutCardsFromTableauPile_Test::
~SolitaireEmptyHandTest_tryPullOutCardsFromTableauPile_Test
          (SolitaireEmptyHandTest_tryPullOutCardsFromTableauPile_Test *this)

{
  SolitaireEmptyHandTest::~SolitaireEmptyHandTest(&this->super_SolitaireEmptyHandTest);
  operator_delete(this,0x218);
  return;
}

Assistant:

TEST_F(SolitaireEmptyHandTest, tryPullOutCardsFromTableauPile) {
    InSequence seq;
    expectSnapshotCreation(lastTableauPileMock, snapshotMock);
    EXPECT_CALL(lastTableauPileMock, tryPullOutCards(quantityToPullOut))
        .WillOnce(Return(twoCards));
    expectSavingSourcePileSnapshot(snapshotMock);

    solitaire.tryPullOutCardsFromTableauPile(lastTableauPileId, quantityToPullOut);
    EXPECT_THAT(solitaire.getCardsInHand(), ContainerEq(twoCards));
}